

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::AppendDescriptorChecksumRequest,cfd::js::api::json::OutputDescriptorResponse,cfd::js::api::AppendDescriptorChecksumRequestStruct,cfd::js::api::OutputDescriptorResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
          *elements_function)

{
  ErrorResponse local_678;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_5c0 [4];
  JsonClassBase<cfd::js::api::json::OutputDescriptorResponse> local_5a0 [4];
  undefined1 local_580 [8];
  OutputDescriptorResponse res_2;
  OutputDescriptorResponseStruct local_520;
  OutputDescriptorResponseStruct local_458;
  undefined1 local_390 [8];
  OutputDescriptorResponseStruct response;
  AppendDescriptorChecksumRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_88 [8];
  AppendDescriptorChecksumRequest req;
  function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
  *elements_function_local;
  function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
  *bitcoin_function_local;
  string *request_message_local;
  string *json_message;
  
  req._88_8_ = elements_function;
  AppendDescriptorChecksumRequest::AppendDescriptorChecksumRequest
            ((AppendDescriptorChecksumRequest *)local_88);
  core::JsonClassBase<cfd::js::api::json::AppendDescriptorChecksumRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::AppendDescriptorChecksumRequest> *)local_88,
             request_message);
  AppendDescriptorChecksumRequest::ConvertToStruct
            ((AppendDescriptorChecksumRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AppendDescriptorChecksumRequest *)local_88);
  OutputDescriptorResponseStruct::OutputDescriptorResponseStruct
            ((OutputDescriptorResponseStruct *)local_390);
  if ((request._24_1_ & 1) == 0) {
    std::
    function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
    ::operator()(&local_520,bitcoin_function,
                 (AppendDescriptorChecksumRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    OutputDescriptorResponseStruct::operator=
              ((OutputDescriptorResponseStruct *)local_390,&local_520);
    OutputDescriptorResponseStruct::~OutputDescriptorResponseStruct(&local_520);
  }
  else {
    std::
    function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
    ::operator()(&local_458,elements_function,
                 (AppendDescriptorChecksumRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    OutputDescriptorResponseStruct::operator=
              ((OutputDescriptorResponseStruct *)local_390,&local_458);
    OutputDescriptorResponseStruct::~OutputDescriptorResponseStruct(&local_458);
  }
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    OutputDescriptorResponse::OutputDescriptorResponse((OutputDescriptorResponse *)local_580);
    OutputDescriptorResponse::ConvertFromStruct
              ((OutputDescriptorResponse *)local_580,(OutputDescriptorResponseStruct *)local_390);
    core::JsonClassBase<cfd::js::api::json::OutputDescriptorResponse>::Serialize_abi_cxx11_
              (local_5a0);
    std::__cxx11::string::operator=((string *)this,(string *)local_5a0);
    std::__cxx11::string::~string((string *)local_5a0);
    OutputDescriptorResponse::~OutputDescriptorResponse((OutputDescriptorResponse *)local_580);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_678,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_5c0);
    std::__cxx11::string::operator=((string *)this,(string *)local_5c0);
    std::__cxx11::string::~string((string *)local_5c0);
    ErrorResponse::~ErrorResponse(&local_678);
  }
  res_2._87_1_ = 1;
  OutputDescriptorResponseStruct::~OutputDescriptorResponseStruct
            ((OutputDescriptorResponseStruct *)local_390);
  AppendDescriptorChecksumRequestStruct::~AppendDescriptorChecksumRequestStruct
            ((AppendDescriptorChecksumRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  AppendDescriptorChecksumRequest::~AppendDescriptorChecksumRequest
            ((AppendDescriptorChecksumRequest *)local_88);
  return this;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}